

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_CutMergeOrdered_(If_Man_t *p,If_Cut_t *pC0,If_Cut_t *pC1,If_Cut_t *pC)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  char cVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  
  uVar12 = *(uint *)&pC0->field_0x1c;
  uVar11 = uVar12 >> 0x18;
  uVar1 = *(uint *)&pC1->field_0x1c;
  uVar8 = uVar1 >> 0x18;
  uVar6 = uVar12 >> 0x10 & 0xff;
  if ((uVar11 == uVar6) && (uVar8 == uVar6)) {
    for (uVar3 = 0; uVar11 != uVar3; uVar3 = uVar3 + 1) {
      if ((&pC0[1].Area)[uVar3] != (&pC1[1].Area)[uVar3]) {
        return 0;
      }
      iVar2 = (int)uVar3;
      p->pPerm[2][uVar3] = iVar2;
      p->pPerm[1][uVar3] = iVar2;
      p->pPerm[0][uVar3] = iVar2;
      (&pC[1].Area)[uVar3] = (&pC0[1].Area)[uVar3];
    }
    cVar7 = (char)(uVar1 >> 0x18);
    pC->field_0x1f = cVar7;
    pC->uSign = pC1->uSign | pC0->uSign;
    p->uSharedMask = 0xffffffff >> (-cVar7 & 0x1fU);
    iVar4 = 1;
  }
  else {
    p->uSharedMask = 0;
    iVar13 = 0;
    iVar2 = 0;
    if (uVar12 < 0x1000000) {
LAB_006f05fd:
      iVar4 = 0;
      if ((int)(iVar2 + uVar8) <= (int)(uVar6 + iVar13)) {
        lVar5 = (long)iVar2;
        iVar2 = iVar2 << 0x18;
        for (lVar9 = (long)iVar13; lVar9 < (long)(ulong)uVar8; lVar9 = lVar9 + 1) {
          p->pPerm[1][lVar9] = (int)lVar5;
          (&pC[1].Area)[lVar5] = (&pC1[1].Area)[lVar9];
          lVar5 = lVar5 + 1;
          iVar2 = iVar2 + 0x1000000;
        }
        *(uint *)&pC->field_0x1c = (*(uint *)&pC->field_0x1c & 0xffffff) + iVar2;
        pC->uSign = pC1->uSign | pC0->uSign;
        iVar4 = 1;
        if (lVar5 < 1) {
          __assert_fail("c > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                        ,0x113,
                        "int If_CutMergeOrdered_(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *)");
        }
      }
    }
    else {
      iVar14 = 0;
      uVar12 = 0;
      if (0xffffff < uVar1) {
        uVar10 = 0;
        uVar3 = 0;
        uVar15 = 0;
        uVar1 = 0;
LAB_006f06d1:
        iVar13 = (int)uVar10;
        iVar14 = (int)uVar3;
        lVar5 = 0;
        while( true ) {
          iVar2 = (int)lVar5;
          if ((iVar14 - uVar6) + iVar2 == 0) {
            return 0;
          }
          lVar9 = (uVar3 & 0xffffffff) + lVar5;
          if ((int)(&pC0[1].Area)[(int)uVar1] < (int)(&pC1[1].Area)[iVar13 + lVar5]) {
            p->pPerm[0][(int)uVar1] = iVar14 + iVar2;
            uVar12 = uVar1 + 1;
            uVar3 = (ulong)(uint)(iVar14 + 1 + iVar2);
            (&pC[1].Area)[iVar14 + lVar5] = (&pC0[1].Area)[(int)uVar1];
            uVar10 = (ulong)(uint)(iVar13 + iVar2);
            uVar1 = uVar12;
            if (uVar12 != uVar11) goto LAB_006f06d1;
            iVar13 = iVar13 + iVar2;
            goto LAB_006f08fe;
          }
          iVar4 = (int)lVar9;
          if ((int)(&pC0[1].Area)[(int)uVar1] <= (int)(&pC1[1].Area)[iVar13 + lVar5]) break;
          p->pPerm[1][iVar13 + lVar5] = iVar4;
          (&pC[1].Area)[iVar14 + lVar5] = (&pC1[1].Area)[iVar13 + lVar5];
          lVar5 = lVar5 + 1;
          if ((iVar13 - uVar8) + (int)lVar5 == 0) {
            iVar14 = iVar14 + (int)lVar5;
            uVar12 = uVar1;
            goto LAB_006f0875;
          }
        }
        p->uSharedMask = p->uSharedMask | 1 << ((byte)lVar9 & 0x1f);
        p->pPerm[2][uVar15] = iVar4;
        p->pPerm[1][iVar13 + lVar5] = iVar4;
        p->pPerm[0][(int)uVar1] = iVar4;
        uVar12 = uVar1 + 1;
        (&pC[1].Area)[iVar14 + lVar5] = (&pC0[1].Area)[(int)uVar1];
        if (uVar12 != uVar11) goto code_r0x006f07e2;
        iVar13 = iVar13 + iVar2 + 1;
LAB_006f08fe:
        iVar2 = iVar14 + 1 + iVar2;
        goto LAB_006f05fd;
      }
LAB_006f0875:
      iVar4 = 0;
      if ((int)(uVar11 + iVar14) <= (int)(uVar6 + uVar12)) {
        lVar5 = (long)iVar14;
        iVar14 = iVar14 << 0x18;
        for (lVar9 = (long)(int)uVar12; lVar9 < (long)(ulong)uVar11; lVar9 = lVar9 + 1) {
          p->pPerm[0][lVar9] = (int)lVar5;
          (&pC[1].Area)[lVar5] = (&pC0[1].Area)[lVar9];
          lVar5 = lVar5 + 1;
          iVar14 = iVar14 + 0x1000000;
        }
        *(uint *)&pC->field_0x1c = (*(uint *)&pC->field_0x1c & 0xffffff) + iVar14;
        pC->uSign = pC1->uSign | pC0->uSign;
        iVar4 = 1;
        if (lVar5 < 1) {
          __assert_fail("c > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                        ,0x107,
                        "int If_CutMergeOrdered_(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *)");
        }
      }
    }
  }
  return iVar4;
code_r0x006f07e2:
  uVar3 = lVar5 + 1 + (uVar3 & 0xffffffff);
  uVar10 = (uVar10 & 0xffffffff) + lVar5 + 1;
  uVar15 = uVar15 + 1;
  uVar1 = uVar12;
  if ((iVar13 - uVar8) + iVar2 == -1) {
    iVar14 = iVar14 + iVar2 + 1;
    goto LAB_006f0875;
  }
  goto LAB_006f06d1;
}

Assistant:

int If_CutMergeOrdered_( If_Man_t * p, If_Cut_t * pC0, If_Cut_t * pC1, If_Cut_t * pC )
{ 
    int nSizeC0 = pC0->nLeaves;
    int nSizeC1 = pC1->nLeaves;
    int nLimit  = pC0->nLimit;
    int i, k, c, s;

    // both cuts are the largest
    if ( nSizeC0 == nLimit && nSizeC1 == nLimit )
    {
        for ( i = 0; i < nSizeC0; i++ )
        {
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
            p->pPerm[0][i] = p->pPerm[1][i] = p->pPerm[2][i] = i;
            pC->pLeaves[i] = pC0->pLeaves[i];
        }
        pC->nLeaves = nLimit;
        pC->uSign = pC0->uSign | pC1->uSign;
        p->uSharedMask = Abc_InfoMask( nLimit );
        return 1;
    }

    // compare two cuts with different numbers
    i = k = c = s = 0;
    p->uSharedMask = 0;
    if ( nSizeC0 == 0 ) goto FlushCut1;
    if ( nSizeC1 == 0 ) goto FlushCut0;
    while ( 1 )
    {
        if ( c == nLimit ) return 0;
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            p->pPerm[0][i] = c;
            pC->pLeaves[c++] = pC0->pLeaves[i++];
            if ( i == nSizeC0 ) goto FlushCut1;
        }
        else if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            p->pPerm[1][k] = c;
            pC->pLeaves[c++] = pC1->pLeaves[k++];
            if ( k == nSizeC1 ) goto FlushCut0;
        }
        else
        {
            p->uSharedMask |= (1 << c);
            p->pPerm[0][i] = p->pPerm[1][k] = p->pPerm[2][s++] = c;
            pC->pLeaves[c++] = pC0->pLeaves[i++]; k++;
            if ( i == nSizeC0 ) goto FlushCut1;
            if ( k == nSizeC1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSizeC0 > nLimit + i ) return 0;
    while ( i < nSizeC0 )
    {
        p->pPerm[0][i] = c;
        pC->pLeaves[c++] = pC0->pLeaves[i++];
    }
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    assert( c > 0 );
    return 1;

FlushCut1:
    if ( c + nSizeC1 > nLimit + k ) return 0;
    while ( k < nSizeC1 )
    {
        p->pPerm[1][k] = c;
        pC->pLeaves[c++] = pC1->pLeaves[k++];
    }
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    assert( c > 0 );
    return 1;
}